

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relooper.cpp
# Opt level: O0

void __thiscall
CFG::Branch::Branch(Branch *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *ValuesInit,
                   Expression *CodeInit)

{
  size_type sVar1;
  Expression *local_20;
  Expression *CodeInit_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *ValuesInit_local;
  Branch *this_local;
  
  this->Ancestor = (Shape *)0x0;
  this->Condition = (Expression *)0x0;
  local_20 = CodeInit;
  CodeInit_local = (Expression *)ValuesInit;
  ValuesInit_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this;
  std::
  unique_ptr<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::default_delete<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::unique_ptr<std::default_delete<std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
            ((unique_ptr<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::default_delete<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)&this->SwitchValues);
  this->Code = local_20;
  sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)CodeInit_local);
  if (sVar1 != 0) {
    std::
    make_unique<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>&>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&stack0xffffffffffffffd8);
    std::
    unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::operator=(&this->SwitchValues,
                (unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *)&stack0xffffffffffffffd8);
    std::
    unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~unique_ptr((unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   *)&stack0xffffffffffffffd8);
  }
  return;
}

Assistant:

Branch::Branch(std::vector<wasm::Index>&& ValuesInit,
               wasm::Expression* CodeInit)
  : Condition(nullptr), Code(CodeInit) {
  if (ValuesInit.size() > 0) {
    SwitchValues = std::make_unique<std::vector<wasm::Index>>(ValuesInit);
  }
  // otherwise, it is the default
}